

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O2

void __thiscall mocker::Annotator::operator()(Annotator *this,VarDeclStmt *node)

{
  ScopeID *scopeID;
  SemanticContext *pSVar1;
  element_type *peVar2;
  size_t sVar3;
  bool bVar4;
  mapped_type *pmVar5;
  __shared_ptr<mocker::ast::Declaration,(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  DuplicatedSymbols *this_01;
  shared_ptr<mocker::ast::ASTNode> local_70;
  shared_ptr<mocker::ast::VarDecl> decl;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<mocker::ast::Declaration,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  checkVarDecl(this,node);
  std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mocker::ast::ASTNode,void>
            ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&local_50,
             (__weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2> *)
             &(node->super_Statement).super_ASTNode.
              super_enable_shared_from_this<mocker::ast::ASTNode>);
  std::static_pointer_cast<mocker::ast::VarDeclStmt,mocker::ast::ASTNode>(&local_70);
  std::make_shared<mocker::ast::VarDecl,std::shared_ptr<mocker::ast::VarDeclStmt>>
            ((shared_ptr<mocker::ast::VarDeclStmt> *)&decl);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_70.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  local_70.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       decl.super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pmVar5 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_mocker::ScopeID>,_std::allocator<std::pair<const_unsigned_long,_mocker::ScopeID>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_mocker::ScopeID>,_std::allocator<std::pair<const_unsigned_long,_mocker::ScopeID>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->ctx->scopeResiding,(key_type *)&local_70);
  scopeID = &this->scopeResiding;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&pmVar5->ids,&scopeID->ids);
  local_70.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)node;
  pmVar5 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_mocker::ScopeID>,_std::allocator<std::pair<const_unsigned_long,_mocker::ScopeID>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_mocker::ScopeID>,_std::allocator<std::pair<const_unsigned_long,_mocker::ScopeID>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->ctx->scopeResiding,(key_type *)&local_70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&pmVar5->ids,&scopeID->ids);
  local_70.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((node->identifier).super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super_ASTNode;
  this_00 = (__shared_ptr<mocker::ast::Declaration,(__gnu_cxx::_Lock_policy)2> *)
            std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->ctx->associatedDecl,(key_type *)&local_70);
  std::__shared_ptr<mocker::ast::Declaration,(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,&decl.super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>);
  local_70.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)node;
  pmVar6 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->pos,(key_type *)&local_70);
  local_50 = decl.super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pmVar7 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->pos,(key_type *)&local_50);
  sVar3 = (pmVar6->first).col;
  (pmVar7->first).line = (pmVar6->first).line;
  (pmVar7->first).col = sVar3;
  sVar3 = (pmVar6->second).col;
  (pmVar7->second).line = (pmVar6->second).line;
  (pmVar7->second).col = sVar3;
  pSVar1 = this->ctx;
  peVar2 = (node->identifier).
           super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<mocker::ast::Declaration,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mocker::ast::VarDecl,void>
            (local_40,&decl.super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>);
  bVar4 = SymTbl::addSymbol(&pSVar1->syms,scopeID,&peVar2->val,
                            (shared_ptr<mocker::ast::Declaration> *)local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  if (bVar4) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&decl.super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  this_01 = (DuplicatedSymbols *)__cxa_allocate_exception(0x68);
  local_70.super___shared_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)node;
  pmVar6 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this->pos,(key_type *)&local_70);
  DuplicatedSymbols::DuplicatedSymbols
            (this_01,pmVar6,
             &((node->identifier).
               super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->val)
  ;
  __cxa_throw(this_01,&DuplicatedSymbols::typeinfo,DuplicatedSymbols::~DuplicatedSymbols);
}

Assistant:

void operator()(ast::VarDeclStmt &node) const override {
    checkVarDecl(node);
    auto decl = std::make_shared<ast::VarDecl>(
        std::static_pointer_cast<ast::VarDeclStmt>(node.shared_from_this()));
    ctx.scopeResiding[decl->getID()] = scopeResiding;
    ctx.scopeResiding[node.getID()] = scopeResiding;
    ctx.associatedDecl[node.identifier->getID()] = decl;
    pos[decl->getID()] = pos[node.getID()];
    bool addRes = ctx.syms.addSymbol(scopeResiding, node.identifier->val, decl);

    if (!addRes)
      throw DuplicatedSymbols(pos[node.getID()], node.identifier->val);
  }